

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_print_stats(void)

{
  ulong uVar1;
  long lVar2;
  
  GAstat_arr = &GAstat.numcre;
  uVar1 = pnga_nodeid();
  printf("\n                         GA Statistics for process %4d\n",uVar1 & 0xffffffff);
  puts("                         ------------------------------\n");
  puts("       create   destroy   get      put      acc     scatter   gather  read&inc");
  printf("calls: ");
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (GAstat_arr[lVar2] < 9999) {
      printf("%4ld     ");
    }
    else {
      printf("%.2e ",(double)GAstat_arr[lVar2]);
    }
  }
  putchar(10);
  if (GAstat.numget == 0) {
    GAstat.numget = 1;
  }
  if (GAstat.numput == 0) {
    GAstat.numput = 1;
  }
  if (GAstat.numacc == 0) {
    GAstat.numacc = 1;
  }
  if (GAstat.numsca == 0) {
    GAstat.numsca = 1;
  }
  if (GAstat.numgat == 0) {
    GAstat.numgat = 1;
  }
  printf("number of processes/call %.2e %.2e %.2e %.2e %.2e\n",
         (double)GAstat.numget_procs / (double)GAstat.numget,
         (double)GAstat.numput_procs / (double)GAstat.numput,
         (double)GAstat.numacc_procs / (double)GAstat.numacc,
         (double)GAstat.numsca_procs / (double)GAstat.numsca,
         (double)GAstat.numgat_procs / (double)GAstat.numgat);
  printf("bytes total:             %.2e %.2e %.2e %.2e %.2e %.2e\n",GAbytes.gettot,GAbytes.puttot,
         GAbytes.acctot,GAbytes.scatot,GAbytes.gattot,GAbytes.rditot);
  printf("bytes remote:            %.2e %.2e %.2e %.2e %.2e %.2e\n",GAbytes.gettot - GAbytes.getloc,
         GAbytes.puttot - GAbytes.putloc,GAbytes.acctot - GAbytes.accloc,
         GAbytes.scatot - GAbytes.scaloc,GAbytes.gattot - GAbytes.gatloc,
         GAbytes.rditot - GAbytes.rdiloc);
  printf("Max memory consumed for GA by this process: %ld bytes\n",GAstat.maxmem);
  if (GAstat.numser != 0) {
    printf("Number of requests serviced: %ld\n");
  }
  fflush(_stdout);
  return;
}

Assistant:

void pnga_print_stats()
{
int i;
     GAstat_arr = (long*)&GAstat;

     printf("\n                         GA Statistics for process %4d\n",(int)pnga_nodeid());
     printf("                         ------------------------------\n\n");
     printf("       create   destroy   get      put      acc     scatter   gather  read&inc\n");

     printf("calls: ");
     for(i=0;i<8;i++) 
        if(GAstat_arr[i] < 9999) printf("%4ld     ",GAstat_arr[i]);
        else                   printf("%.2e ",(double)GAstat_arr[i]);
     printf("\n");
     if(GAstat.numget==0)GAstat.numget=1;
     if(GAstat.numput==0)GAstat.numput=1;
     if(GAstat.numacc==0)GAstat.numacc=1;
     if(GAstat.numsca==0)GAstat.numsca=1;
     if(GAstat.numgat==0)GAstat.numgat=1;
     printf("number of processes/call %.2e %.2e %.2e %.2e %.2e\n",
                   ((double)GAstat.numget_procs)/(double)GAstat.numget,
                   ((double)GAstat.numput_procs)/(double)GAstat.numput,
                   ((double)GAstat.numacc_procs)/(double)GAstat.numacc,
                   ((double)GAstat.numsca_procs)/(double)GAstat.numsca,
                   ((double)GAstat.numgat_procs)/(double)GAstat.numgat);


     printf("bytes total:             %.2e %.2e %.2e %.2e %.2e %.2e\n",
                   GAbytes.gettot, GAbytes.puttot, GAbytes.acctot,
                   GAbytes.scatot, GAbytes.gattot, GAbytes.rditot);

     printf("bytes remote:            %.2e %.2e %.2e %.2e %.2e %.2e\n",
                   GAbytes.gettot - GAbytes.getloc, 
                   GAbytes.puttot - GAbytes.putloc,
                   GAbytes.acctot - GAbytes.accloc,
                   GAbytes.scatot - GAbytes.scaloc,
                   GAbytes.gattot - GAbytes.gatloc,
                   GAbytes.rditot - GAbytes.rdiloc);

     printf("Max memory consumed for GA by this process: %ld bytes\n",GAstat.maxmem);
     if(GAstat.numser)
        printf("Number of requests serviced: %ld\n",GAstat.numser);
     fflush(stdout);
}